

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  undefined1 auVar2 [16];
  int i;
  int iVar3;
  ImVector<ImVec2> *this_00;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 in_register_00001304 [12];
  ImVec2 local_30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  this_00 = &this->_Path;
  if ((radius == 0.0) && (!NAN(radius))) {
    ImVector<ImVec2>::push_back(this_00,center);
    return;
  }
  ImVector<ImVec2>::reserve(this_00,num_segments + 1 + this_00->Size);
  for (iVar3 = 0; iVar3 <= num_segments; iVar3 = iVar3 + 1) {
    auVar6._0_4_ = (float)iVar3 / (float)num_segments;
    auVar6._4_12_ = in_register_00001304;
    auVar2 = vfmadd213ss_fma(auVar6,ZEXT416((uint)(a_max - a_min)),ZEXT416((uint)a_min));
    fVar1 = center->x;
    auVar4._0_4_ = cosf(auVar2._0_4_);
    auVar4._4_60_ = extraout_var;
    auVar6 = vfmadd132ss_fma(auVar4._0_16_,ZEXT416((uint)fVar1),ZEXT416((uint)radius));
    fVar1 = center->y;
    auVar5._0_4_ = sinf(auVar2._0_4_);
    auVar5._4_60_ = extraout_var_00;
    auVar2 = vfmadd132ss_fma(auVar5._0_16_,ZEXT416((uint)fVar1),ZEXT416((uint)radius));
    local_30.y = auVar2._0_4_;
    local_30.x = auVar6._0_4_;
    ImVector<ImVec2>::push_back(this_00,&local_30);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}